

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall sznet::Logger::Impl::finish(Impl *this)

{
  self *psVar1;
  LogStream *pLVar2;
  Impl *this_local;
  
  psVar1 = LogStream::operator<<(&this->m_stream," - ");
  pLVar2 = sznet::operator<<(psVar1,&this->m_basename);
  psVar1 = LogStream::operator<<(pLVar2,':');
  pLVar2 = LogStream::operator<<(psVar1,this->m_line);
  LogStream::operator<<(pLVar2,'\n');
  return;
}

Assistant:

void Logger::Impl::finish()
{
	m_stream << " - " << m_basename << ':' << m_line << '\n';
}